

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HelpMessages.cpp
# Opt level: O3

string * ApprovalTests::HelpMessages::getUnconfiguredRootDirectory_abi_cxx11_(void)

{
  string *in_RDI;
  string helpMessage;
  string local_38;
  
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,
             "* Hello from Approval Tests.\n*\n* It looks like your program is calling some code that requires knowledge of\n* the location of the main() in your source tree.\n*\n* To do this, add the following to your main.cpp file:\n*\n*     APPROVAL_TESTS_REGISTER_MAIN_DIRECTORY\n*\n* Currently, this is only required if you are using TemplatedCustomNamer\'s\n* {RelativeTestSourceDirectory}.\n"
             ,"");
  topAndTailHelpMessage(in_RDI,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p);
  }
  return in_RDI;
}

Assistant:

std::string HelpMessages::getUnconfiguredRootDirectory()
    {
        std::string helpMessage = R"(* Hello from Approval Tests.
*
* It looks like your program is calling some code that requires knowledge of
* the location of the main() in your source tree.
*
* To do this, add the following to your main.cpp file:
*
*     APPROVAL_TESTS_REGISTER_MAIN_DIRECTORY
*
* Currently, this is only required if you are using TemplatedCustomNamer's
* {RelativeTestSourceDirectory}.
)";
        return topAndTailHelpMessage(helpMessage);
    }